

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Limiter.h
# Opt level: O1

void __thiscall Limiter::Limiter(Limiter *this,int maxRPS,int timeFramesPS)

{
  microseconds timeBetweenTicks;
  size_type __n;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 8) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  __n = (size_type)timeFramesPS;
  std::vector<int,_std::allocator<int>_>::vector
            (&(this->hitQueue_).hitsPerTimeFrame_,__n,(allocator_type *)local_58._M_pod_data);
  (this->hitQueue_).activeHitsSum_ = 0;
  (this->hitQueue_).windowBegin_ = 0;
  (this->hitQueue_).windowEnd_ = timeFramesPS + -1;
  timeBetweenTicks.__r = __n * 1000000;
  if (2 < __n + 1) {
    timeBetweenTicks.__r = 0;
  }
  local_58._8_8_ = 0;
  pcStack_40 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/4sily[P]rate-limiter-cpp/Limiter.h:28:57)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/4sily[P]rate-limiter-cpp/Limiter.h:28:57)>
             ::_M_manager;
  local_58._M_unused._M_object = this;
  Tick::Tick(&this->tick_,timeBetweenTicks,(function<void_()> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  this->maxRPS_ = maxRPS;
  return;
}

Assistant:

Limiter(int maxRPS, int timeFramesPS)
        : hitQueue_(timeFramesPS)
        // note that callbacks may start coming right after this
        , tick_(std::chrono::seconds(1) / timeFramesPS, [this] { OnTimeFrameBoundary(); })
        , maxRPS_(maxRPS)
    {
    }